

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint64_t t1ha_32be(void *data,size_t len,uint64_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t *puVar8;
  uint64_t uVar9;
  undefined8 in_RDX;
  ulong in_RSI;
  uint32_t *in_RDI;
  uint8_t *v;
  uint32_t d13;
  uint32_t c02;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t *v_1;
  void *detent;
  uint32_t d;
  uint32_t c;
  uint32_t align [4];
  int need_align;
  uint32_t b;
  uint32_t a;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint32_t *local_50;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  uint local_20;
  uint local_1c;
  undefined8 local_18;
  ulong local_10;
  uint32_t *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = rot32((uint32_t)in_RSI,0x11);
  local_1c = uVar1 + (int)local_18;
  local_20 = (uint)local_10 ^ (uint)((ulong)local_18 >> 0x20);
  in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
  local_24 = 0;
  if (0x10 < local_10) {
    local_3c = local_1c ^ 0xffffffff;
    local_40 = rot32(local_20,5);
    puVar8 = (uint32_t *)((long)local_8 + (local_10 - 0xf));
    do {
      local_50 = local_8;
      if (local_24 != 0) {
        local_38 = *(undefined8 *)local_8;
        local_30 = *(undefined8 *)(local_8 + 2);
        local_50 = (uint32_t *)&local_38;
      }
      uVar1 = fetch32_be(local_50);
      uVar2 = fetch32_be(local_50 + 1);
      uVar3 = fetch32_be(local_50 + 2);
      uVar4 = fetch32_be(local_50 + 3);
      in_stack_ffffffffffffff84 = uVar1;
      uVar5 = rot32(uVar3 + local_3c,0xb);
      uVar6 = in_stack_ffffffffffffff84 ^ uVar5;
      in_stack_ffffffffffffff88 = uVar2;
      uVar5 = rot32(uVar4 + local_40,0x11);
      uVar7 = in_stack_ffffffffffffff88 + uVar5;
      uVar2 = rot32(local_20 + uVar2,7);
      local_3c = uVar2 ^ local_3c;
      uVar1 = rot32(local_1c + uVar1,3);
      local_40 = uVar1 ^ local_40;
      local_20 = (uVar6 + uVar4) * -0x3564b8cb;
      local_1c = (uVar7 ^ uVar3) * -0x6d287d97;
      local_8 = local_8 + 4;
    } while (local_8 < puVar8);
    in_stack_ffffffffffffff80 = local_1c + local_3c;
    local_40 = local_20 + local_40;
    uVar1 = rot32(in_stack_ffffffffffffff80,0x10);
    local_1c = (uVar1 + local_40) * -0x3b44ca8b ^ local_1c;
    uVar1 = rot32(local_40,0x10);
    local_20 = (in_stack_ffffffffffffff80 + uVar1) * -0x35d25905 ^ local_20;
    local_10 = local_10 & 0xf;
  }
  puVar8 = local_8;
  if ((local_24 != 0) && (4 < local_10)) {
    memcpy(&local_38,local_8,local_10);
    puVar8 = (uint32_t *)&local_38;
  }
  switch(local_10) {
  default:
    fetch32_be(puVar8);
    mixup32(puVar8,(uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    puVar8 = puVar8 + 1;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    fetch32_be(puVar8);
    mixup32(puVar8,(uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    puVar8 = puVar8 + 1;
  case 5:
  case 6:
  case 7:
  case 8:
    fetch32_be(puVar8);
    mixup32(puVar8,(uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    puVar8 = puVar8 + 1;
  case 1:
  case 2:
  case 3:
  case 4:
    tail32_be(puVar8,local_10);
    mixup32(puVar8,(uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
  case 0:
    uVar9 = remix32(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    return uVar9;
  }
}

Assistant:

uint64_t t1ha_32be(const void *data, size_t len, uint64_t seed) {
  uint32_t a = rot32((uint32_t)len, s1) + (uint32_t)seed;
  uint32_t b = (uint32_t)len ^ (uint32_t)(seed >> 32);

  const int need_align = (((uintptr_t)data) & 3) != 0 && !UNALIGNED_OK;
  uint32_t align[4];

  if (unlikely(len > 16)) {
    uint32_t c = ~a;
    uint32_t d = rot32(b, 5);
    const void *detent = (const uint8_t *)data + len - 15;
    do {
      const uint32_t *v = (const uint32_t *)data;
      if (unlikely(need_align))
        v = (const uint32_t *)memcpy(&align, v, 16);

      uint32_t w0 = fetch32_be(v + 0);
      uint32_t w1 = fetch32_be(v + 1);
      uint32_t w2 = fetch32_be(v + 2);
      uint32_t w3 = fetch32_be(v + 3);

      uint32_t c02 = w0 ^ rot32(w2 + c, 11);
      uint32_t d13 = w1 + rot32(w3 + d, s1);
      c ^= rot32(b + w1, 7);
      d ^= rot32(a + w0, 3);
      b = q1 * (c02 + w3);
      a = q0 * (d13 ^ w2);

      data = (const uint32_t *)data + 4;
    } while (likely(data < detent));

    c += a;
    d += b;
    a ^= q6 * (rot32(c, 16) + d);
    b ^= q5 * (c + rot32(d, 16));

    len &= 15;
  }

  const uint8_t *v = (const uint8_t *)data;
  if (unlikely(need_align) && len > 4)
    v = (const uint8_t *)memcpy(&align, v, len);

  switch (len) {
  default:
    mixup32(&a, &b, fetch32_be(v), q4);
    v += 4;
  case 12:
  case 11:
  case 10:
  case 9:
    mixup32(&b, &a, fetch32_be(v), q3);
    v += 4;
  case 8:
  case 7:
  case 6:
  case 5:
    mixup32(&a, &b, fetch32_be(v), q2);
    v += 4;
  case 4:
  case 3:
  case 2:
  case 1:
    mixup32(&b, &a, tail32_be(v, len), q1);
  case 0:
    return remix32(a, b);
  }
}